

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

void __thiscall
QPixmapStyle::drawPushButton
          (QPixmapStyle *this,QStyleOption *option,QPainter *painter,QWidget *param_3)

{
  uint uVar1;
  ControlDescriptor control;
  uint uVar2;
  ControlDescriptor CVar3;
  
  uVar1 = (option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i;
  uVar2 = uVar1 & 0x20;
  CVar3 = PB_Pressed;
  if ((uVar1 & 4) == 0) {
    CVar3 = (uVar2 >> 5) * 3 + PB_Enabled;
  }
  control = (uVar2 == 0) + 6 + (uint)(uVar2 == 0);
  if ((uVar1 & 1) != 0) {
    control = CVar3;
  }
  drawCachedPixmap(this,control,&option->rect,painter);
  return;
}

Assistant:

void QPixmapStyle::drawPushButton(const QStyleOption *option,
                                  QPainter *painter, const QWidget *) const
{
    const bool checked = option->state & State_On;
    const bool pressed = option->state & State_Sunken;
    const bool enabled = option->state & State_Enabled;

    ControlDescriptor control = PB_Enabled;
    if (enabled)
        control = pressed ? PB_Pressed : (checked ? PB_Checked : PB_Enabled);
    else
        control = checked ? PB_PressedDisabled : PB_Disabled;
    drawCachedPixmap(control, option->rect, painter);
}